

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_EnhancedGroundCombatSoldier *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  GED_BasicGroundCombatSoldier::GetAsString_abi_cxx11_
            (&local_1c8,&this->super_GED_BasicGroundCombatSoldier);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"GED Enhanced Ground Combat Vehicle\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\tWater Status:         ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ounce/s\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tRest Status:          ",0x17);
  ENUMS::GetEnumAsStringRestStatus_abi_cxx11_
            (&local_1c8,(ENUMS *)(ulong)this->m_ui8RestStatus,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tPrimary Ammunition:   ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tSecondary Ammunition: ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

KString GED_EnhancedGroundCombatSoldier::GetAsString() const
{
    KStringStream ss;

    ss << GED_BasicGroundCombatSoldier::GetAsString();

    ss << "GED Enhanced Ground Combat Vehicle\n"
       << "\tWater Status:         " << ( KUINT16 )m_ui8WaterStatus                  << " ounce/s\n"
       << "\tRest Status:          " << GetEnumAsStringRestStatus( m_ui8RestStatus ) << "\n"
       << "\tPrimary Ammunition:   " << ( KUINT16 )m_ui8PriAmmun                     << "\n"
       << "\tSecondary Ammunition: " << ( KUINT16 )m_ui8SecAmmun                     << "\n";

    return ss.str();
}